

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O3

vector<char,_std::allocator<char>_> * __thiscall
diffusion::ShmReader::cyclic_read
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,ShmReader *this,Size size)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  allocator_type local_31;
  
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,(long)size,&local_31);
  if (0 < size) {
    iVar3 = this->shm_body_size_;
    iVar4 = this->reader_shm_body_offset_;
    uVar5 = size;
    do {
      uVar2 = iVar3 - iVar4;
      if ((int)uVar5 < iVar3 - iVar4) {
        uVar2 = uVar5;
      }
      memcpy((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start + ((long)size - (ulong)uVar5),
             this->shm_body_position_ + iVar4,(long)(int)uVar2);
      iVar4 = this->reader_shm_body_offset_ + uVar2;
      iVar3 = this->shm_body_size_;
      if (iVar4 == iVar3) {
        iVar4 = 0;
      }
      this->reader_shm_body_offset_ = iVar4;
      uVar6 = uVar5 - uVar2;
      bVar1 = (int)uVar2 <= (int)uVar5;
      uVar5 = uVar6;
    } while (uVar6 != 0 && bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> ShmReader::cyclic_read(Size size) {
    std::vector<char> data(size);
    auto bytes_left = size;
    while (bytes_left > 0) {
        auto write_pointer = data.data() + size - bytes_left;
        auto space_left = shm_body_size_ - reader_shm_body_offset_;
        auto bytes_can_be_read_without_wrap = (bytes_left > space_left) ? space_left : bytes_left;
        std::memcpy(write_pointer, shm_body_position_ + reader_shm_body_offset_, bytes_can_be_read_without_wrap);
        reader_shm_body_offset_ += bytes_can_be_read_without_wrap;
        bytes_left -= bytes_can_be_read_without_wrap;
        if (reader_shm_body_offset_ == shm_body_size_) {
            reader_shm_body_offset_ = 0;
        }
    }
    return data;
}